

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializeProcesses.cpp
# Opt level: O2

void __thiscall adios2::shm::SerializeProcesses::~SerializeProcesses(SerializeProcesses *this)

{
  string local_28;
  
  if (this->m_nProc < 2) {
    operator_delete(this->m_ShmValue);
  }
  else {
    local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
    local_28._M_string_length = 0;
    local_28.field_2._M_local_buf[0] = '\0';
    helper::Comm::Win_free(this->m_NodeComm,&this->m_Win,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
  }
  helper::Comm::Win::~Win(&this->m_Win);
  return;
}

Assistant:

SerializeProcesses::~SerializeProcesses()
{
    if (m_nProc > 1)
    {
        m_NodeComm->Win_free(m_Win);
    }
    else
    {
        delete m_ShmValue;
    }
}